

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_used_labels.cc
# Opt level: O3

void __thiscall
re2c::GoBitmap::used_labels
          (GoBitmap *this,
          set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> *used)

{
  if (this->hgo != (SwitchIf *)0x0) {
    SwitchIf::used_labels(this->hgo,used);
  }
  std::
  _Rb_tree<re2c::label_t,re2c::label_t,std::_Identity<re2c::label_t>,std::less<re2c::label_t>,std::allocator<re2c::label_t>>
  ::_M_insert_unique<re2c::label_t_const&>
            ((_Rb_tree<re2c::label_t,re2c::label_t,std::_Identity<re2c::label_t>,std::less<re2c::label_t>,std::allocator<re2c::label_t>>
              *)used,&this->bitmap_state->label);
  if (this->lgo != (SwitchIf *)0x0) {
    SwitchIf::used_labels(this->lgo,used);
    return;
  }
  return;
}

Assistant:

void GoBitmap::used_labels (std::set<label_t> & used)
{
	if (hgo != NULL)
	{
		hgo->used_labels (used);
	}
	used.insert (bitmap_state->label);
	if (lgo != NULL)
	{
		lgo->used_labels (used);
	}
}